

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintHelpListPolicies(cmDocumentation *this,ostream *os)

{
  cmDocumentation *this_00;
  undefined1 local_38 [32];
  
  this_00 = (cmDocumentation *)local_38;
  local_38._0_8_ = local_38 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"policy/*","");
  PrintNames(this_00,os,(string *)local_38);
  if ((undefined1 *)local_38._0_8_ != local_38 + 0x10) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
  }
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListPolicies(std::ostream& os)
{
  this->PrintNames(os, "policy/*");
  return true;
}